

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.h
# Opt level: O2

bool __thiscall capnp::schema::Value::Reader::hasList(Reader *this)

{
  bool bVar1;
  PointerReader local_28;
  
  if ((0xf < (this->_reader).dataSize) && (*(this->_reader).data == 0xe)) {
    if ((this->_reader).pointerCount == 0) {
      local_28.segment = (SegmentReader *)0x0;
      local_28.capTable = (CapTableReader *)0x0;
      local_28.pointer = (WirePointer *)0x0;
      local_28.nestingLimit = 0x7fffffff;
    }
    else {
      local_28.pointer = (this->_reader).pointers;
      local_28.nestingLimit = (this->_reader).nestingLimit;
      local_28.segment = (this->_reader).segment;
      local_28.capTable = (this->_reader).capTable;
    }
    bVar1 = _::PointerReader::isNull(&local_28);
    return !bVar1;
  }
  return false;
}

Assistant:

inline T StructReader::getDataField(StructDataOffset offset) const {
  if ((offset + ONE * ELEMENTS) * capnp::bitsPerElement<T>() <= dataSize) {
    return reinterpret_cast<const WireValue<T>*>(data)[unbound(offset / ELEMENTS)].get();
  } else {
    return static_cast<T>(0);
  }
}